

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateImplMemberInit
          (MessageGenerator *this,Printer *p,InitType init_type)

{
  Options *desc;
  FieldGeneratorTable *this_00;
  pointer ppFVar1;
  FieldDescriptor *field;
  ushort *puVar2;
  MaybeInitializedPtr MVar3;
  bool bVar4;
  ArenaDtorNeeds AVar5;
  FieldGenerator *this_01;
  value_type pOVar6;
  undefined8 extraout_RAX;
  Options *in_RCX;
  undefined8 uVar7;
  undefined1 split;
  char *in_R8;
  char *pcVar8;
  pointer ppFVar9;
  MemberInitSeparator separator;
  Iterator __begin4;
  bool dtor_on_demand;
  MaybeInitializedPtr local_188;
  InitType local_17c;
  MessageGenerator *local_178;
  anon_class_1_0_00000001 local_169;
  MemberInitSeparator local_168;
  string local_158;
  undefined1 local_138 [32];
  undefined1 local_118 [24];
  code *local_100;
  byte local_f8;
  _Alloc_hider local_f0;
  undefined1 local_e8 [24];
  bool local_d0;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_c8;
  HeapOrSoo local_80;
  string local_70;
  Iterator local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  desc = &this->options_;
  local_188 = (MaybeInitializedPtr)p;
  local_17c = init_type;
  local_178 = this;
  SimpleBaseClass_abi_cxx11_((string *)local_138,(cpp *)this->descriptor_,(Descriptor *)desc,in_RCX)
  ;
  uVar7 = local_138._8_8_;
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,
                    CONCAT17(local_138[0x17],
                             CONCAT16(local_138[0x16],CONCAT24(local_138._20_2_,local_138._16_4_)))
                    + 1);
  }
  if (uVar7 != 0) {
    GenerateImplMemberInit((MessageGenerator *)local_138);
    __clang_call_terminate(extraout_RAX);
  }
  local_80.heap.control = (ctrl_t *)*(size_t *)((long)local_188.p + 0x58);
  *(size_t *)((long)local_188.p + 0x68) =
       (size_t)((long)local_80.heap.control + *(size_t *)((long)local_188.p + 0x68));
  local_168.separators_ = false;
  local_80.heap.slot_array.p = local_188;
  local_168.printer_ = (Printer *)local_188;
  if ((local_17c != kConstexpr) && (0 < local_178->descriptor_->extension_range_count_)) {
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
    in_R8 = "_extensions_{visibility, arena}";
    io::Printer::Emit((Printer *)local_188.p,0,0,0x1f);
  }
  if ((local_178->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_178->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    AVar5 = NeedsArenaDestructor(local_178);
    local_50.idx = CONCAT31(local_50.idx._1_3_,AVar5 == kOnDemand);
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
    MVar3 = local_188;
    local_158.field_2._M_local_buf[4] = 'e';
    local_158.field_2._M_local_buf[5] = 's';
    local_158.field_2._M_local_buf[6] = '\0';
    local_138._0_8_ = local_138 + 0x10;
    local_138._16_4_ = 0x756c6176;
    local_138._20_2_ = 0x7365;
    local_138[0x16] = '\0';
    local_138[0x17] = local_158.field_2._M_local_buf[7];
    local_138[0x1f] = local_158.field_2._M_local_buf[0xf];
    local_138._8_8_ = 6;
    local_158._M_string_length = 0;
    local_158.field_2._M_allocated_capacity._0_4_ = 0x756c6100;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_118._0_8_ = operator_new(0x20);
    *(MessageGenerator **)local_118._0_8_ = local_178;
    *(MaybeInitializedPtr **)(local_118._0_8_ + 8) = &local_188;
    *(Iterator **)(local_118._0_8_ + 0x10) = &local_50;
    *(undefined1 *)(local_118._0_8_ + 0x18) = 0;
    local_100 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_118._8_8_ = 0;
    local_118._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_f8 = 1;
    local_e8._0_8_ = 0;
    local_e8[8] = '\0';
    local_d0 = false;
    local_f0._M_p = local_e8 + 8;
    std::__cxx11::string::_M_replace((ulong)&local_f0,0,(char *)0x0,0x1258832);
    local_c8._M_engaged = false;
    in_R8 = "_inlined_string_donated_{$values$}";
    io::Printer::Emit((Printer *)MVar3.p,local_138,1,0x22);
    if (local_c8._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_c8);
    }
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,CONCAT71(local_e8._9_7_,local_e8[8]) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_f8]._M_data)
              ((anon_class_1_0_00000001 *)&local_70,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)local_118);
    local_f8 = 0xff;
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT17(local_138[0x17],
                               CONCAT16(local_138[0x16],CONCAT24(local_138._20_2_,local_138._16_4_))
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT17(local_158.field_2._M_local_buf[7],
                               CONCAT16(local_158.field_2._M_local_buf[6],
                                        CONCAT15(local_158.field_2._M_local_buf[5],
                                                 CONCAT14(local_158.field_2._M_local_buf[4],
                                                          local_158.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
  }
  if ((local_178->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_178->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (local_17c == kArenaCopy) {
      cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
      io::Printer::Emit((Printer *)local_188.p,0,0,0x1b,"_has_bits_{from._has_bits_}");
    }
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
    in_R8 = "_cached_size_{0}";
    io::Printer::Emit((Printer *)local_188.p,0,0,0x10);
  }
  split = SUB81(in_R8,0);
  ppFVar9 = (local_178->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar1 = (local_178->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar9 != ppFVar1) {
    this_00 = &local_178->field_generators_;
    do {
      field = *ppFVar9;
      bVar4 = ShouldSplit(field,desc);
      if (!bVar4) {
        this_01 = FieldGeneratorTable::get(this_00,field);
        if (local_17c == kArenaCopy) {
          if (((this_01->impl_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
               .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>.
              _M_head_impl)->has_trivial_value_ == false) {
            cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
            FieldGenerator::GenerateMemberCopyConstructor(this_01,(Printer *)local_188.p);
          }
        }
        else if (local_17c == kArena) {
          if (((this_01->impl_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
               .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>.
              _M_head_impl)->has_trivial_zero_default_ == false) {
            cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
            FieldGenerator::GenerateMemberConstructor(this_01,(Printer *)local_188.p);
          }
        }
        else if (local_17c == kConstexpr) {
          cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
          FieldGenerator::GenerateMemberConstexprConstructor(this_01,(Printer *)local_188.p);
        }
      }
      split = SUB81(in_R8,0);
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 != ppFVar1);
  }
  bVar4 = ShouldSplit(local_178->descriptor_,desc);
  if (bVar4) {
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
    MVar3 = local_188;
    local_158.field_2._M_allocated_capacity._0_4_ = 0x656d616e;
    local_158._M_string_length = 4;
    local_158.field_2._M_local_buf[4] = '\0';
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    DefaultInstanceName_abi_cxx11_
              (&local_70,(cpp *)local_178->descriptor_,(Descriptor *)desc,(Options *)0x1,(bool)split
              );
    io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_138,&local_158,&local_70);
    io::Printer::Emit((Printer *)MVar3.p,local_138,1,0x2e,
                      "_split_{const_cast<Split*>(&$name$._instance)}");
    if (local_c8._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_c8);
    }
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,CONCAT71(local_e8._9_7_,local_e8[8]) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_f8]._M_data)
              ((anon_class_1_0_00000001 *)&local_50,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)local_118);
    local_f8 = 0xff;
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT17(local_138[0x17],
                               CONCAT16(local_138[0x16],CONCAT24(local_138._20_2_,local_138._16_4_))
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(EnforceOptimizeMode)local_70._M_dataplus._M_p)
        != &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_70._M_dataplus._M_p._4_4_,
                               (EnforceOptimizeMode)local_70._M_dataplus._M_p),
                      local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT17(local_158.field_2._M_local_buf[7],
                               CONCAT16(local_158.field_2._M_local_buf[6],
                                        CONCAT15(local_158.field_2._M_local_buf[5],
                                                 CONCAT14(local_158.field_2._M_local_buf[4],
                                                          local_158.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
  }
  local_70._M_string_length = (size_type)local_178->descriptor_;
  local_70._M_dataplus._M_p._0_4_ = kNoEnforcement;
  local_50.idx = ((Descriptor *)local_70._M_string_length)->real_oneof_decl_count_;
  local_50.descriptor = (Descriptor *)local_70._M_string_length;
  bVar4 = cpp::operator==((Iterator *)&local_70,&local_50);
  if (!bVar4) {
    do {
      pOVar6 = OneOfRangeImpl::Iterator::operator*((Iterator *)&local_70);
      cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
      MVar3 = local_188;
      local_158.field_2._M_allocated_capacity._0_4_ = 0x656d616e;
      local_158._M_string_length = 4;
      local_158.field_2._M_local_buf[4] = '\0';
      puVar2 = (ushort *)(pOVar6->all_names_).payload_;
      local_40._M_len = (size_t)*puVar2;
      local_40._M_str = (char *)((long)puVar2 + ~local_40._M_len);
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
                ((Sub *)local_138,&local_158,&local_40);
      io::Printer::Emit((Printer *)MVar3.p,(Sub *)local_138,1,9,"$name$_{}");
      if (local_c8._M_engaged == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  (&local_c8);
      }
      if (local_f0._M_p != local_e8 + 8) {
        operator_delete(local_f0._M_p,CONCAT71(local_e8._9_7_,local_e8[8]) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[local_f8]._M_data)
                (&local_169,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)local_118);
      local_f8 = 0xff;
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,
                        CONCAT17(local_138[0x17],
                                 CONCAT16(local_138[0x16],
                                          CONCAT24(local_138._20_2_,local_138._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT17(local_158.field_2._M_local_buf[7],
                                 CONCAT16(local_158.field_2._M_local_buf[6],
                                          CONCAT15(local_158.field_2._M_local_buf[5],
                                                   CONCAT14(local_158.field_2._M_local_buf[4],
                                                            local_158.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      local_70._M_dataplus._M_p._0_4_ = (EnforceOptimizeMode)local_70._M_dataplus._M_p + kSpeed;
      bVar4 = cpp::operator==((Iterator *)&local_70,&local_50);
    } while (!bVar4);
  }
  if ((local_178->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (local_178->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
    io::Printer::Emit((Printer *)local_188.p,0,0,0x10,"_cached_size_{0}");
  }
  local_70._M_dataplus._M_p._0_4_ = local_178->descriptor_->real_oneof_decl_count_;
  if ((EnforceOptimizeMode)local_70._M_dataplus._M_p != kNoEnforcement) {
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
    MVar3 = local_188;
    if (local_17c == kArenaCopy) {
      local_158.field_2._M_local_buf[4] = 's';
      local_158.field_2._M_local_buf[5] = '\0';
      local_138._0_8_ = local_138 + 0x10;
      local_138._16_4_ = 0x65736163;
      local_138._20_2_ = 0x73;
      local_138[0x16] = local_158.field_2._M_local_buf[6];
      local_138[0x17] = local_158.field_2._M_local_buf[7];
      local_138[0x1f] = local_158.field_2._M_local_buf[0xf];
      local_138._8_8_ = 5;
      local_158._M_string_length = 0;
      local_158.field_2._M_allocated_capacity._0_4_ = 0x65736100;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_118._0_8_ = operator_new(0x18);
      *(string **)local_118._0_8_ = &local_70;
      *(MaybeInitializedPtr **)(local_118._0_8_ + 8) = &local_188;
      *(undefined1 *)(local_118._0_8_ + 0x10) = 0;
      local_100 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_118._8_8_ = 0;
      local_118._16_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_f8 = 1;
      local_e8._0_8_ = 0;
      local_e8[8] = '\0';
      local_d0 = false;
      local_f0._M_p = local_e8 + 8;
      std::__cxx11::string::_M_replace((ulong)&local_f0,0,(char *)0x0,0x1258832);
      local_c8._M_engaged = false;
      io::Printer::Emit((Printer *)MVar3.p,local_138,1,0x15,"_oneof_case_{$cases$}");
      if (local_c8._M_engaged == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  (&local_c8);
      }
      if (local_f0._M_p != local_e8 + 8) {
        operator_delete(local_f0._M_p,CONCAT71(local_e8._9_7_,local_e8[8]) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[local_f8]._M_data)
                ((anon_class_1_0_00000001 *)&local_50,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)local_118);
      local_f8 = 0xff;
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,
                        CONCAT17(local_138[0x17],
                                 CONCAT16(local_138[0x16],
                                          CONCAT24(local_138._20_2_,local_138._16_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT17(local_158.field_2._M_local_buf[7],
                                 CONCAT16(local_158.field_2._M_local_buf[6],
                                          CONCAT15(local_158.field_2._M_local_buf[5],
                                                   CONCAT14(local_158.field_2._M_local_buf[4],
                                                            local_158.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
    }
    else {
      io::Printer::Emit((Printer *)local_188.p,0,0,0xe,"_oneof_case_{}");
    }
  }
  if ((local_17c != kConstexpr) && (local_178->num_weak_fields_ != 0)) {
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&local_168);
    uVar7 = 0x23;
    if (local_17c == kArenaCopy) {
      uVar7 = 0x3a;
    }
    pcVar8 = "_weak_field_map_{visibility, arena}";
    if (local_17c == kArenaCopy) {
      pcVar8 = "_weak_field_map_{visibility, arena, from._weak_field_map_}";
    }
    io::Printer::Emit((Printer *)local_188.p,0,0,uVar7,pcVar8);
  }
  if (local_168.separators_ == true) {
    io::Printer::Outdent(local_168.printer_);
  }
  *(size_t *)((long)local_80.heap.slot_array + 0x68) =
       *(size_t *)((long)local_80.heap.slot_array + 0x68) - local_80._0_8_;
  return;
}

Assistant:

void MessageGenerator::GenerateImplMemberInit(io::Printer* p,
                                              InitType init_type) {
  ABSL_DCHECK(!HasSimpleBaseClass(descriptor_, options_));

  auto indent = p->WithIndent();
  MemberInitSeparator separator(p);

  auto init_extensions = [&] {
    if (descriptor_->extension_range_count() > 0 &&
        init_type != InitType::kConstexpr) {
      separator();
      p->Emit("_extensions_{visibility, arena}");
    }
  };

  auto init_inlined_string_indices = [&] {
    if (!inlined_string_indices_.empty()) {
      bool dtor_on_demand = NeedsArenaDestructor() == ArenaDtorNeeds::kOnDemand;
      auto values = [&] {
        for (size_t i = 0; i < InlinedStringDonatedSize(); ++i) {
          if (i > 0) {
            p->Emit(", ");
          }
          p->Emit(dtor_on_demand
                      ? "::_pbi::InitDonatingStates()"
                      : "::_pbi::InitDonatingStates() & 0xFFFFFFFEu");
        }
      };
      separator();
      p->Emit({{"values", values}}, "_inlined_string_donated_{$values$}");
    }
  };

  auto init_has_bits = [&] {
    if (!has_bit_indices_.empty()) {
      if (init_type == InitType::kArenaCopy) {
        separator();
        p->Emit("_has_bits_{from._has_bits_}");
      }
      separator();
      p->Emit("_cached_size_{0}");
    }
  };

  auto init_fields = [&] {
    for (auto* field : optimized_order_) {
      if (ShouldSplit(field, options_)) continue;

      auto const& generator = field_generators_.get(field);
      switch (init_type) {
        case InitType::kConstexpr:
          separator();
          generator.GenerateMemberConstexprConstructor(p);
          break;
        case InitType::kArena:
          if (!generator.has_trivial_zero_default()) {
            separator();
            generator.GenerateMemberConstructor(p);
          }
          break;
        case InitType::kArenaCopy:
          if (!generator.has_trivial_value()) {
            separator();
            generator.GenerateMemberCopyConstructor(p);
          }
          break;
      }
    }
  };

  auto init_split = [&] {
    if (ShouldSplit(descriptor_, options_)) {
      separator();
      p->Emit({{"name", DefaultInstanceName(descriptor_, options_, true)}},
              "_split_{const_cast<Split*>(&$name$._instance)}");
    }
  };

  auto init_oneofs = [&] {
    for (auto oneof : OneOfRange(descriptor_)) {
      separator();
      p->Emit({{"name", oneof->name()}}, "$name$_{}");
    }
  };

  auto init_cached_size_if_no_hasbits = [&] {
    if (has_bit_indices_.empty()) {
      separator();
      p->Emit("_cached_size_{0}");
    }
  };

  auto init_oneof_cases = [&] {
    if (int count = descriptor_->real_oneof_decl_count()) {
      separator();
      if (init_type == InitType::kArenaCopy) {
        auto cases = [&] {
          for (int i = 0; i < count; ++i) {
            p->Emit({{"index", i}, {"comma", i ? ", " : ""}},
                    "$comma$from._oneof_case_[$index$]");
          }
        };
        p->Emit({{"cases", cases}}, "_oneof_case_{$cases$}");
      } else {
        p->Emit("_oneof_case_{}");
      }
    }
  };

  auto init_weak_field_map = [&] {
    if (num_weak_fields_ && init_type != InitType::kConstexpr) {
      separator();
      if (init_type == InitType::kArenaCopy) {
        p->Emit("_weak_field_map_{visibility, arena, from._weak_field_map_}");
      } else {
        p->Emit("_weak_field_map_{visibility, arena}");
      }
    }
  };

  // Initialization order of the various fields inside `_impl_(...)`
  init_extensions();
  init_inlined_string_indices();
  init_has_bits();
  init_fields();
  init_split();
  init_oneofs();
  init_cached_size_if_no_hasbits();
  init_oneof_cases();
  init_weak_field_map();
}